

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::EndMenuBar(void)

{
  ImGuiContext_conflict *pIVar1;
  _Bool _Var2;
  ImGuiWindow *window_00;
  ImGuiGroupData *pIVar3;
  bool bVar4;
  ImGuiWindow_conflict *pIStack_20;
  ImGuiNavLayer layer;
  ImGuiWindow *nav_earliest_child;
  ImGuiContext *g;
  ImGuiWindow *window;
  
  window_00 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((window_00->SkipItems & 1U) == 0) {
    _Var2 = NavMoveRequestButNoResultYet();
    if ((_Var2) &&
       (((pIVar1->NavMoveDir == 0 || (pIVar1->NavMoveDir == 1)) &&
        ((pIVar1->NavWindow->Flags & 0x10000000U) != 0)))) {
      pIStack_20 = pIVar1->NavWindow;
      while( true ) {
        bVar4 = false;
        if (pIStack_20->ParentWindow != (ImGuiWindow_conflict *)0x0) {
          bVar4 = (pIStack_20->ParentWindow->Flags & 0x10000000U) != 0;
        }
        if (!bVar4) break;
        pIStack_20 = pIStack_20->ParentWindow;
      }
      if ((((ImGuiWindow *)pIStack_20->ParentWindow == window_00) &&
          ((pIStack_20->DC).ParentLayoutType == 0)) && ((pIVar1->NavMoveFlags & 0x80U) == 0)) {
        if (((window_00->DC).NavLayersActiveMaskNext & 2U) == 0) {
          __assert_fail("window->DC.NavLayersActiveMaskNext & (1 << layer)",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                        ,0x1a48,"void ImGui::EndMenuBar()");
        }
        FocusWindow((ImGuiWindow_conflict *)window_00);
        SetNavID(window_00->NavLastIds[1],ImGuiNavLayer_Menu,0,window_00->NavRectRel + 1);
        pIVar1->NavDisableHighlight = true;
        pIVar1->NavMousePosDirty = true;
        pIVar1->NavDisableMouseHover = true;
        NavMoveRequestForward
                  (pIVar1->NavMoveDir,pIVar1->NavMoveClipDir,pIVar1->NavMoveFlags,
                   pIVar1->NavMoveScrollFlags);
      }
    }
    if ((window_00->Flags & 0x400U) == 0) {
      __assert_fail("window->Flags & ImGuiWindowFlags_MenuBar",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                    ,0x1a52,"void ImGui::EndMenuBar()");
    }
    if (((window_00->DC).MenuBarAppending & 1U) == 0) {
      __assert_fail("window->DC.MenuBarAppending",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                    ,0x1a53,"void ImGui::EndMenuBar()");
    }
    PopClipRect();
    PopID();
    (window_00->DC).MenuBarOffset.x = (window_00->DC).CursorPos.x - (window_00->Pos).x;
    pIVar3 = ImVector<ImGuiGroupData>::back(&pIVar1->GroupStack);
    pIVar3->EmitItem = false;
    EndGroup();
    (window_00->DC).LayoutType = 1;
    (window_00->DC).NavLayerCurrent = ImGuiNavLayer_Main;
    (window_00->DC).MenuBarAppending = false;
  }
  return;
}

Assistant:

void ImGui::EndMenuBar()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;
    ImGuiContext& g = *GImGui;

    // Nav: When a move request within one of our child menu failed, capture the request to navigate among our siblings.
    if (NavMoveRequestButNoResultYet() && (g.NavMoveDir == ImGuiDir_Left || g.NavMoveDir == ImGuiDir_Right) && (g.NavWindow->Flags & ImGuiWindowFlags_ChildMenu))
    {
        // Try to find out if the request is for one of our child menu
        ImGuiWindow* nav_earliest_child = g.NavWindow;
        while (nav_earliest_child->ParentWindow && (nav_earliest_child->ParentWindow->Flags & ImGuiWindowFlags_ChildMenu))
            nav_earliest_child = nav_earliest_child->ParentWindow;
        if (nav_earliest_child->ParentWindow == window && nav_earliest_child->DC.ParentLayoutType == ImGuiLayoutType_Horizontal && (g.NavMoveFlags & ImGuiNavMoveFlags_Forwarded) == 0)
        {
            // To do so we claim focus back, restore NavId and then process the movement request for yet another frame.
            // This involve a one-frame delay which isn't very problematic in this situation. We could remove it by scoring in advance for multiple window (probably not worth bothering)
            const ImGuiNavLayer layer = ImGuiNavLayer_Menu;
            IM_ASSERT(window->DC.NavLayersActiveMaskNext & (1 << layer)); // Sanity check
            FocusWindow(window);
            SetNavID(window->NavLastIds[layer], layer, 0, window->NavRectRel[layer]);
            g.NavDisableHighlight = true; // Hide highlight for the current frame so we don't see the intermediary selection.
            g.NavDisableMouseHover = g.NavMousePosDirty = true;
            NavMoveRequestForward(g.NavMoveDir, g.NavMoveClipDir, g.NavMoveFlags, g.NavMoveScrollFlags); // Repeat
        }
    }

    IM_MSVC_WARNING_SUPPRESS(6011); // Static Analysis false positive "warning C6011: Dereferencing NULL pointer 'window'"
    IM_ASSERT(window->Flags & ImGuiWindowFlags_MenuBar);
    IM_ASSERT(window->DC.MenuBarAppending);
    PopClipRect();
    PopID();
    window->DC.MenuBarOffset.x = window->DC.CursorPos.x - window->Pos.x; // Save horizontal position so next append can reuse it. This is kinda equivalent to a per-layer CursorPos.
    g.GroupStack.back().EmitItem = false;
    EndGroup(); // Restore position on layer 0
    window->DC.LayoutType = ImGuiLayoutType_Vertical;
    window->DC.NavLayerCurrent = ImGuiNavLayer_Main;
    window->DC.MenuBarAppending = false;
}